

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O1

SizeT SPARC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  
  if (size < 4) {
    return 0;
  }
  iVar2 = -ip;
  uVar3 = 0;
  do {
    if (data[uVar3] == '\x7f') {
      if (0xbf < data[uVar3 + 1]) goto LAB_005d15a2;
    }
    else if ((data[uVar3] == '@') && (data[uVar3 + 1] < 0x40)) {
LAB_005d15a2:
      iVar4 = ip + (int)uVar3;
      if (encoding == 0) {
        iVar4 = iVar2;
      }
      uVar1 = iVar4 + ((uint)data[uVar3 + 3] |
                      (uint)data[uVar3 + 2] << 8 | (uint)data[uVar3 + 1] << 0x10) * 4;
      uVar5 = (int)(uVar1 * 0x80) >> 9 & 0x3fc00000;
      data[uVar3] = (byte)(uVar5 >> 0x18) | 0x40;
      data[uVar3 + 1] = (byte)((uVar1 >> 2) >> 0x10) & 0x3f | (byte)(uVar5 >> 0x10);
      data[uVar3 + 2] = (Byte)(uVar1 >> 10);
      data[uVar3 + 3] = (Byte)(uVar1 >> 2);
    }
    uVar3 = uVar3 + 4;
    iVar2 = iVar2 + -4;
    if (size - 4 < (uVar3 & 0xffffffff)) {
      return uVar3 & 0xffffffff;
    }
  } while( true );
}

Assistant:

SizeT SPARC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  UInt32 i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] == 0x40 && (data[i + 1] & 0xC0) == 0x00) ||
        (data[i] == 0x7F && (data[i + 1] & 0xC0) == 0xC0))
    {
      UInt32 src =
        ((UInt32)data[i + 0] << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3]);
      UInt32 dest;
      
      src <<= 2;
      if (encoding)
        dest = ip + i + src;
      else
        dest = src - (ip + i);
      dest >>= 2;
      
      dest = (((0 - ((dest >> 22) & 1)) << 22) & 0x3FFFFFFF) | (dest & 0x3FFFFF) | 0x40000000;

      data[i + 0] = (Byte)(dest >> 24);
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] = (Byte)dest;
    }
  }
  return i;
}